

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O2

void wasm::ABI::getStackSpace(Index local,Function *func,Index size,Module *wasm)

{
  ExpressionList *this;
  HeapType *this_00;
  pointer puVar1;
  Expression **ppEVar2;
  uintptr_t uVar3;
  string_view name;
  size_t sVar4;
  char *pcVar5;
  Function *func_00;
  Index index;
  Module *pMVar6;
  Block *this_01;
  GlobalGet *left;
  Const *right;
  Binary *value;
  LocalSet *pLVar7;
  GlobalSet *pGVar8;
  Return *pRVar9;
  Block *this_02;
  LocalGet *pLVar10;
  undefined1 *puVar11;
  uint x;
  undefined1 auVar12 [8];
  pointer pppEVar13;
  ExpressionList *this_03;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  Signature SVar14;
  optional<wasm::Type> type;
  undefined1 local_238 [8];
  anon_class_40_5_8eb904dd makeStackRestore;
  undefined1 local_b0 [8];
  FindAllPointers<wasm::Return> finder;
  Builder local_60;
  Global *stackPointer;
  Function *local_50;
  Expression **local_48;
  Index local_40;
  Index local_3c;
  Index local_local;
  Builder builder;
  
  local_50 = func;
  local_40 = local;
  pMVar6 = (Module *)getStackPointerGlobal(wasm);
  local_60.wasm = pMVar6;
  if (pMVar6 == (Module *)0x0) {
    Fatal::Fatal((Fatal *)local_238);
    Fatal::operator<<((Fatal *)local_238,
                      (char (*) [48])"getStackSpace: failed to find the stack pointer");
    Fatal::~Fatal((Fatal *)local_238);
  }
  x = size + 0xf & 0xfffffff0;
  puVar1 = (wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar1 == (wasm->memories).
                super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    pppEVar13 = (pointer)0x2;
  }
  else {
    pppEVar13 = (pointer)(((puVar1->_M_t).
                           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                           .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->addressType)
                         .id;
  }
  finder.list.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pppEVar13;
  stackPointer._4_4_ = x;
  _local_local = wasm;
  this_01 = MixedArena::alloc<wasm::Block>(&wasm->allocator);
  if (pppEVar13 == (pointer)0x2) {
    sVar4 = (((Importable *)&pMVar6->exports)->super_Named).name.super_IString.str._M_len;
    pcVar5 = (((Importable *)&pMVar6->exports)->super_Named).name.super_IString.str._M_str;
    left = MixedArena::alloc<wasm::GlobalGet>(&wasm->allocator);
    (left->name).super_IString.str._M_len = sVar4;
    (left->name).super_IString.str._M_str = pcVar5;
    (left->super_SpecificExpression<(wasm::Expression::Id)10>).super_Expression.type.id = 2;
    right = Builder::makeConst<int>((Builder *)&local_local,x);
    value = Builder::makeBinary((Builder *)&local_local,SubInt32,(Expression *)left,
                                (Expression *)right);
    this_03 = &this_01->list;
    name = (((Importable *)&(local_60.wasm)->exports)->super_Named).name.super_IString.str;
    pLVar7 = Builder::makeLocalTee
                       ((Builder *)&local_local,local_40,(Expression *)value,
                        (Type)finder.list.
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pGVar8 = Builder::makeGlobalSet((Builder *)&local_local,(Name)name,(Expression *)pLVar7);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_03->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)pGVar8);
    puVar11 = local_238;
    makeStackRestore.builder = &local_60;
    makeStackRestore.stackPointer = (Global **)&local_40;
    makeStackRestore.pointerType = (Type *)((long)&stackPointer + 4);
    local_48 = &local_50->body;
    local_238 = (undefined1  [8])&local_local;
    makeStackRestore.local =
         (Index *)&finder.list.
                   super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
    FindAllPointers<wasm::Return>::FindAllPointers
              ((FindAllPointers<wasm::Return> *)local_b0,local_48);
    for (auVar12 = local_b0; func_00 = local_50,
        auVar12 !=
        (undefined1  [8])
        finder.list.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
        _M_impl.super__Vector_impl_data._M_start; auVar12 = (undefined1  [8])((long)auVar12 + 8)) {
      ppEVar2 = *(Expression ***)auVar12;
      pRVar9 = Expression::cast<wasm::Return>(*ppEVar2);
      if ((pRVar9->value == (Expression *)0x0) || ((pRVar9->value->type).id == 1)) {
        pGVar8 = getStackSpace::anon_class_40_5_8eb904dd::operator()
                           ((anon_class_40_5_8eb904dd *)local_238);
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)puVar11;
        this_02 = Builder::makeSequence
                            ((Builder *)&local_local,(Expression *)pGVar8,(Expression *)pRVar9,type)
        ;
      }
      else {
        this_02 = MixedArena::alloc<wasm::Block>(&_local_local->allocator);
        local_3c = Builder::addVar(local_50,(Type)(pRVar9->value->type).id);
        pLVar7 = Builder::makeLocalSet((Builder *)&local_local,local_3c,pRVar9->value);
        this = &this_02->list;
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&this->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                   ,(Expression *)pLVar7);
        pGVar8 = getStackSpace::anon_class_40_5_8eb904dd::operator()
                           ((anon_class_40_5_8eb904dd *)local_238);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&this->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                   ,(Expression *)pGVar8);
        uVar3 = (pRVar9->value->type).id;
        pLVar10 = MixedArena::alloc<wasm::LocalGet>(&_local_local->allocator);
        pLVar10->index = local_3c;
        (pLVar10->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
             uVar3;
        pRVar9 = MixedArena::alloc<wasm::Return>(&_local_local->allocator);
        pRVar9->value = (Expression *)pLVar10;
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&this->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                   ,(Expression *)pRVar9);
        puVar11 = (undefined1 *)0x0;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pRVar9;
        Block::finalize(this_02,type_,Unknown);
      }
      *ppEVar2 = (Expression *)this_02;
    }
    pGVar8 = (GlobalSet *)*local_48;
    uVar3 = (pGVar8->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id;
    if (uVar3 == 0) {
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_03->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pGVar8);
      pGVar8 = getStackSpace::anon_class_40_5_8eb904dd::operator()
                         ((anon_class_40_5_8eb904dd *)local_238);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_03->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pGVar8);
    }
    else if (uVar3 == 1) {
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_03->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pGVar8);
    }
    else {
      this_00 = &local_50->type;
      SVar14 = HeapType::getSignature(this_00);
      index = Builder::addVar(func_00,SVar14.results.id);
      pLVar7 = Builder::makeLocalSet((Builder *)&local_local,index,*local_48);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_03->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pLVar7);
      pGVar8 = getStackSpace::anon_class_40_5_8eb904dd::operator()
                         ((anon_class_40_5_8eb904dd *)local_238);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_03->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pGVar8);
      SVar14 = HeapType::getSignature(this_00);
      pGVar8 = (GlobalSet *)MixedArena::alloc<wasm::LocalGet>(&_local_local->allocator);
      *(Index *)&(pGVar8->name).super_IString.str._M_len = index;
      (pGVar8->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id =
           SVar14.results.id.id;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_03->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pGVar8);
    }
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pGVar8;
    Block::finalize(this_01,type__00,Unknown);
    *local_48 = (Expression *)this_01;
    std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)local_b0);
    return;
  }
  handle_unreachable("unhandled pointerType",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/abi/stack.h"
                     ,0x40);
}

Assistant:

inline void
getStackSpace(Index local, Function* func, Index size, Module& wasm) {
  auto* stackPointer = getStackPointerGlobal(wasm);
  if (!stackPointer) {
    Fatal() << "getStackSpace: failed to find the stack pointer";
  }
  // align the size
  size = stackAlign(size);
  auto pointerType =
    !wasm.memories.empty() ? wasm.memories[0]->addressType : Type::i32;
  // TODO: find existing stack usage, and add on top of that - carefully
  Builder builder(wasm);
  auto* block = builder.makeBlock();
  // TODO: add stack max check
  Expression* added;
  if (pointerType == Type::i32) {
    // The stack goes downward in the LLVM wasm backend.
    added =
      builder.makeBinary(SubInt32,
                         builder.makeGlobalGet(stackPointer->name, pointerType),
                         builder.makeConst(int32_t(size)));
  } else {
    WASM_UNREACHABLE("unhandled pointerType");
  }
  block->list.push_back(builder.makeGlobalSet(
    stackPointer->name, builder.makeLocalTee(local, added, pointerType)));
  auto makeStackRestore = [&]() {
    return builder.makeGlobalSet(
      stackPointer->name,
      builder.makeBinary(AddInt32,
                         builder.makeLocalGet(local, pointerType),
                         builder.makeConst(int32_t(size))));
  };
  // add stack restores to the returns
  FindAllPointers<Return> finder(func->body);
  for (auto** ptr : finder.list) {
    auto* ret = (*ptr)->cast<Return>();
    if (ret->value && ret->value->type != Type::unreachable) {
      // handle the returned value
      auto* block = builder.makeBlock();
      auto temp = builder.addVar(func, ret->value->type);
      block->list.push_back(builder.makeLocalSet(temp, ret->value));
      block->list.push_back(makeStackRestore());
      block->list.push_back(
        builder.makeReturn(builder.makeLocalGet(temp, ret->value->type)));
      block->finalize();
      *ptr = block;
    } else {
      // restore, then return
      *ptr = builder.makeSequence(makeStackRestore(), ret);
    }
  }
  // add stack restores to the body
  if (func->body->type == Type::none) {
    block->list.push_back(func->body);
    block->list.push_back(makeStackRestore());
  } else if (func->body->type == Type::unreachable) {
    block->list.push_back(func->body);
    // no need to restore the old stack value, we're gone anyhow
  } else {
    // save the return value
    auto temp = builder.addVar(func, func->getResults());
    block->list.push_back(builder.makeLocalSet(temp, func->body));
    block->list.push_back(makeStackRestore());
    block->list.push_back(builder.makeLocalGet(temp, func->getResults()));
  }
  block->finalize();
  func->body = block;
}